

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpTokens.cpp
# Opt level: O3

bool __thiscall glslang::TPpContext::TokenStream::peekUntokenizedPasting(TokenStream *this)

{
  ulong uVar1;
  pointer pTVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar1 = this->currentPos;
  pTVar2 = (this->stream).
           super_vector<glslang::TPpContext::TokenStream::Token,_glslang::pool_allocator<glslang::TPpContext::TokenStream::Token>_>
           .
           super__Vector_base<glslang::TPpContext::TokenStream::Token,_glslang::pool_allocator<glslang::TPpContext::TokenStream::Token>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->stream).
                super_vector<glslang::TPpContext::TokenStream::Token,_glslang::pool_allocator<glslang::TPpContext::TokenStream::Token>_>
                .
                super__Vector_base<glslang::TPpContext::TokenStream::Token,_glslang::pool_allocator<glslang::TPpContext::TokenStream::Token>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 3;
  uVar3 = lVar4 * 0x6db6db6db6db6db7;
  if (uVar1 < uVar3) {
    pTVar2 = pTVar2 + uVar1;
    uVar5 = uVar1;
    do {
      uVar5 = uVar5 + 1;
      if (pTVar2->atom != 0x20) {
        if ((pTVar2->atom == 0x23) && (uVar5 < uVar3)) {
          bVar6 = pTVar2[1].atom == 0x23;
          goto LAB_00444e74;
        }
        break;
      }
      this->currentPos = uVar5;
      pTVar2 = pTVar2 + 1;
    } while (lVar4 * -0x6db6db6db6db6db7 + uVar5 != 0);
  }
  bVar6 = false;
LAB_00444e74:
  this->currentPos = uVar1;
  return bVar6;
}

Assistant:

bool TPpContext::TokenStream::peekUntokenizedPasting()
{
    // don't return early, have to restore this
    size_t savePos = currentPos;

    // skip white-space
    while (peekToken(' '))
        ++currentPos;

    // check for ##
    bool pasting = false;
    if (peekToken('#')) {
        ++currentPos;
        if (peekToken('#'))
            pasting = true;
    }

    currentPos = savePos;

    return pasting;
}